

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

int Extra_TruthVarsSymm(uint *pTruth,int nVars,int iVar0,int iVar1)

{
  int iVar2;
  int iVar1_local;
  int iVar0_local;
  int nVars_local;
  uint *pTruth_local;
  
  if (nVars < 10) {
    Extra_TruthCopy(Extra_TruthVarsSymm::uTemp0,pTruth,nVars);
    Extra_TruthCofactor0(Extra_TruthVarsSymm::uTemp0,nVars,iVar0);
    Extra_TruthCofactor1(Extra_TruthVarsSymm::uTemp0,nVars,iVar1);
    Extra_TruthCopy(Extra_TruthVarsSymm::uTemp1,pTruth,nVars);
    Extra_TruthCofactor1(Extra_TruthVarsSymm::uTemp1,nVars,iVar0);
    Extra_TruthCofactor0(Extra_TruthVarsSymm::uTemp1,nVars,iVar1);
    iVar2 = Extra_TruthIsEqual(Extra_TruthVarsSymm::uTemp0,Extra_TruthVarsSymm::uTemp1,nVars);
    return iVar2;
  }
  __assert_fail("nVars <= 9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                ,0x29c,"int Extra_TruthVarsSymm(unsigned int *, int, int, int)");
}

Assistant:

int Extra_TruthVarsSymm( unsigned * pTruth, int nVars, int iVar0, int iVar1 )
{
    static unsigned uTemp0[16], uTemp1[16];
    assert( nVars <= 9 );
    // compute Cof01
    Extra_TruthCopy( uTemp0, pTruth, nVars );
    Extra_TruthCofactor0( uTemp0, nVars, iVar0 );
    Extra_TruthCofactor1( uTemp0, nVars, iVar1 );
    // compute Cof10
    Extra_TruthCopy( uTemp1, pTruth, nVars );
    Extra_TruthCofactor1( uTemp1, nVars, iVar0 );
    Extra_TruthCofactor0( uTemp1, nVars, iVar1 );
    // compare
    return Extra_TruthIsEqual( uTemp0, uTemp1, nVars );
}